

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

void __thiscall
asl::WebSocketServer::process(WebSocketServer *this,Socket *client,Dic<asl::String> *headers)

{
  Mutex *__mutex;
  int *piVar1;
  SmartObject_ *pSVar2;
  bool bVar3;
  WebSocketServer *pWVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  String *pSVar8;
  anon_union_16_2_78e7fdac_for_String_2 *paVar9;
  undefined8 uVar10;
  char *pcVar11;
  Lock l;
  long lVar12;
  bool bVar13;
  WebSocket ws;
  String key;
  String digest;
  Hash hash;
  undefined1 local_138 [56];
  undefined1 local_100 [16];
  anon_union_16_2_78e7fdac_for_String_2 local_f0;
  Socket *local_e0;
  String local_d8;
  Map<asl::String,_asl::String> *local_c0;
  WebSocketServer *local_b8;
  WebSocket *local_b0;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  Hash local_44;
  
  local_b8 = this;
  String::String((String *)local_138,"Upgrade");
  iVar6 = Map<asl::String,_asl::String>::indexOf
                    (&headers->super_Map<asl::String,_asl::String>,(String *)local_138);
  bVar5 = true;
  if (-1 < iVar6) {
    String::String(&local_78,"Upgrade");
    pSVar8 = Map<asl::String,_asl::String>::operator[]
                       (&headers->super_Map<asl::String,_asl::String>,&local_78);
    if (pSVar8->_size == 0) {
      paVar9 = &pSVar8->field_2;
    }
    else {
      paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar8->field_2)._str;
    }
    iVar7 = strcmp(paVar9->_space,"websocket");
    if (iVar7 == 0) {
      String::String(&local_90,"Connection");
      pSVar8 = Map<asl::String,_asl::String>::operator[]
                         (&headers->super_Map<asl::String,_asl::String>,&local_90);
      String::String(&local_a8,", ");
      String::split((String *)local_100,pSVar8);
      local_e0 = client;
      String::String(&local_60,"Upgrade");
      iVar7 = *(int *)&((String *)(local_100._0_8_ + -0x18))->field_2;
      bVar3 = true;
      if ((long)iVar7 < 1) {
        bVar5 = true;
        client = local_e0;
      }
      else {
        lVar12 = 0;
        local_c0 = &headers->super_Map<asl::String,_asl::String>;
        do {
          bVar5 = String::operator==((String *)((long)(int *)local_100._0_8_ + lVar12),&local_60);
          if (bVar5) break;
          bVar13 = (long)iVar7 * 0x18 + -0x18 != lVar12;
          lVar12 = lVar12 + 0x18;
        } while (bVar13);
        bVar5 = !bVar5;
        client = local_e0;
        headers = (Dic<asl::String> *)local_c0;
      }
      goto LAB_00128804;
    }
  }
  bVar3 = false;
LAB_00128804:
  if (bVar3) {
    if (local_60._size != 0) {
      free(local_60.field_2._str);
    }
    Array<asl::String>::~Array((Array<asl::String> *)local_100);
    if (local_a8._size != 0) {
      free(local_a8.field_2._str);
    }
    if (local_90._size != 0) {
      free(local_90.field_2._str);
    }
  }
  if ((-1 < iVar6) && (local_78._size != 0)) {
    free(local_78.field_2._str);
  }
  if (local_138._0_4_ != 0) {
    free((void *)local_138._8_8_);
  }
  if (bVar5) {
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])
              (pSVar2,"HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request",0x33);
  }
  else {
    String::String((String *)local_138,"Sec-Websocket-Key");
    pSVar8 = Map<asl::String,_asl::String>::operator[]
                       (&headers->super_Map<asl::String,_asl::String>,(String *)local_138);
    iVar6 = pSVar8->_len;
    String::alloc((String *)(local_100 + 8),iVar6);
    uVar10 = local_f0._0_8_;
    if (local_100._8_4_ == 0) {
      uVar10 = &local_f0;
    }
    if (pSVar8->_size == 0) {
      paVar9 = &pSVar8->field_2;
    }
    else {
      paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar8->field_2)._str;
    }
    local_100._12_4_ = iVar6;
    memcpy((void *)uVar10,paVar9,(long)iVar6 + 1);
    if (local_138._0_4_ != 0) {
      free((void *)local_138._8_8_);
    }
    String::concat((String *)local_138,(String *)(local_100 + 8),
                   "258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
    SHA1::hash(&local_44,(String *)local_138);
    if (local_138._0_4_ != 0) {
      free((void *)local_138._8_8_);
    }
    encodeBase64(&local_d8,local_44._a,0x14);
    uVar10 = local_d8.field_2._str;
    if (local_d8._size == 0) {
      uVar10 = &local_d8.field_2;
    }
    String::String((String *)local_138,0xb4,
                   "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\n"
                   ,uVar10);
    pcVar11 = (char *)local_138._8_8_;
    if (local_138._0_4_ == 0) {
      pcVar11 = local_138 + 8;
    }
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,pcVar11,(ulong)(uint)local_138._4_4_);
    if (local_138._0_4_ != 0) {
      free((void *)local_138._8_8_);
    }
    String::String((String *)local_138,"Sec-Websocket-Protocol");
    iVar6 = Map<asl::String,_asl::String>::indexOf
                      (&headers->super_Map<asl::String,_asl::String>,(String *)local_138);
    if (local_138._0_4_ != 0) {
      free((void *)local_138._8_8_);
    }
    if (-1 < iVar6) {
      pSVar2 = (client->super_SmartObject)._p;
      (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,"Sec-Websocket-Protocol: chat\r\n",0x1e);
    }
    pSVar2 = (client->super_SmartObject)._p;
    (*pSVar2->_vptr_SmartObject_[0xe])(pSVar2,"\r\n",2);
    WebSocket::WebSocket((WebSocket *)local_138,client,false);
    pWVar4 = local_b8;
    __mutex = &local_b8->_mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    local_b0 = (WebSocket *)local_138;
    Array<asl::WebSocket_*>::insert(&pWVar4->_clients,-1,&local_b0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*(pWVar4->super_SocketServer)._vptr_SocketServer[1])(pWVar4,local_138);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    local_b0 = (WebSocket *)local_138;
    Array<asl::WebSocket_*>::removeOne(&pWVar4->_clients,&local_b0,0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*((client->super_SmartObject)._p)->_vptr_SmartObject_[0xb])();
    LOCK();
    piVar1 = (int *)(local_138._8_8_ + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free((char *)(local_138._8_8_ + -0x10));
      local_138._8_8_ = (char *)0x0;
    }
    if (CONCAT44(local_138._4_4_,local_138._0_4_) != 0) {
      LOCK();
      piVar1 = (int *)(CONCAT44(local_138._4_4_,local_138._0_4_) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && ((long *)CONCAT44(local_138._4_4_,local_138._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_138._4_4_,local_138._0_4_) + 8))();
      }
    }
    if (local_d8._size != 0) {
      free(local_d8.field_2._str);
    }
    if (local_100._8_4_ != 0) {
      free((void *)local_f0._0_8_);
    }
  }
  return;
}

Assistant:

void WebSocketServer::process(Socket& client, const Dic<String>& headers)
{
	if (!headers.has("Upgrade") || headers["Upgrade"] != "websocket" || !headers["Connection"].split(", ").contains("Upgrade"))
	{
		client << "HTTP/1.1 400 Bad request\r\n\r\nNot a WebSocket request";
		return;
	}

	String key = headers["Sec-Websocket-Key"];

	SHA1::Hash hash = SHA1::hash(key + "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
	String digest = encodeBase64(hash, hash.length());

	client << String(180, "HTTP/1.1 101 Switching Protocols\r\n"
		"Upgrade: websocket\r\n"
		"Connection: Upgrade\r\n"
		"Sec-WebSocket-Accept: %s\r\n", *digest);

	if (headers.has("Sec-Websocket-Protocol"))
		client << "Sec-Websocket-Protocol: chat\r\n";
	client << "\r\n";

	WebSocket ws(client, false);
	{
		Lock l(_mutex);
		_clients << &ws;
	}
	serve(ws);
	{
		Lock l(_mutex);
		_clients.removeOne(&ws);
	}
	client.close();
}